

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# garray.c
# Opt level: O0

GArray * g_array_remove_range(GArray *farray,guint index_,guint length)

{
  uint local_24;
  guint i;
  GRealArray *array;
  guint length_local;
  guint index__local;
  GArray *farray_local;
  
  if (*(long *)&farray[1].len != 0) {
    for (local_24 = 0; local_24 < length; local_24 = local_24 + 1) {
      (**(code **)&farray[1].len)(farray->data + *(int *)&farray[1].data * (index_ + local_24));
    }
  }
  if (index_ + length != farray->len) {
    memmove(farray->data + *(int *)&farray[1].data * index_,
            farray->data + *(int *)&farray[1].data * (index_ + length),
            (ulong)((farray->len - (index_ + length)) * *(int *)&farray[1].data));
  }
  farray->len = farray->len - length;
  if (((ulong)farray[1].data & 0x100000000) != 0) {
    memset(farray->data + *(int *)&farray[1].data * farray->len,0,(ulong)*(uint *)&farray[1].data);
  }
  return farray;
}

Assistant:

GArray* g_array_remove_range (GArray *farray,
        guint   index_,
        guint   length)
{
    GRealArray *array = (GRealArray*) farray;

    g_return_val_if_fail (array, NULL);
    g_return_val_if_fail (index_ <= array->len, NULL);
    g_return_val_if_fail (index_ + length <= array->len, NULL);

    if (array->clear_func != NULL)
    {
        guint i;

        for (i = 0; i < length; i++)
            array->clear_func (g_array_elt_pos (array, index_ + i));
    }

    if (index_ + length != array->len)
        memmove (g_array_elt_pos (array, index_),
                g_array_elt_pos (array, index_ + length),
                (array->len - (index_ + length)) * array->elt_size);

    array->len -= length;
    if (g_mem_gc_friendly)
        g_array_elt_zero (array, array->len, length);
    else
        g_array_zero_terminate (array);

    return farray;
}